

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.h
# Opt level: O2

void __thiscall ast::Dir_equ::~Dir_equ(Dir_equ *this)

{
  Statement::~Statement((Statement *)this);
  operator_delete(this);
  return;
}

Assistant:

string listing() {
		return string_printf("%4d%10c\t", location.line, ' ');
	}